

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O1

String * __thiscall Args::CmdLine::value(String *__return_storage_ptr__,CmdLine *this,String *name)

{
  int iVar1;
  ArgIface *pAVar2;
  undefined4 extraout_var;
  CmdLine *pCVar3;
  _func_int **pp_Var4;
  
  pAVar2 = findArgument(this,name);
  if (pAVar2 == (ArgIface *)0x0) {
LAB_00148736:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    iVar1 = (*pAVar2->_vptr_ArgIface[2])(pAVar2);
    if ((iVar1 == 2) || (iVar1 == 1)) {
      iVar1 = (*pAVar2->_vptr_ArgIface[0x13])(pAVar2);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pp_Var4 = *(_func_int ***)CONCAT44(extraout_var,iVar1);
      pCVar3 = (CmdLine *)((undefined8 *)CONCAT44(extraout_var,iVar1))[1];
    }
    else {
      if (iVar1 != 0) goto LAB_00148736;
      pCVar3 = (CmdLine *)details::DummyString<void>::c_string_abi_cxx11_;
      if ((CmdLine *)pAVar2[0xd]._vptr_ArgIface != pAVar2[0xd].m_cmdLine) {
        pCVar3 = (CmdLine *)pAVar2[0xd]._vptr_ArgIface;
      }
      if (pAVar2[0xb].m_cmdLine != (CmdLine *)pAVar2[0xc]._vptr_ArgIface) {
        pCVar3 = pAVar2[0xb].m_cmdLine;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pp_Var4 = (pCVar3->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>)._vptr_API;
      pCVar3 = (pCVar3->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>).m_parent;
    }
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pp_Var4,
               (long)&(pCVar3->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>)._vptr_API +
               (long)pp_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

String value(
		//! Name of the argument. Should be full name, i.e '-a' or '--arg'
		//! or 'add' if it's a command or subcommand.
		const String & name ) const
	{
		const auto * arg = findArgument( name );

		if( arg )
		{
			switch( arg->type() )
			{
				case ArgType::Command :
					return ( static_cast< const Command* > ( arg )->value() );

				case ArgType::Arg :
					return ( static_cast< const Arg* > ( arg )->value() );

				case ArgType::MultiArg :
					return ( static_cast< const MultiArg* > ( arg )->value() );

				default :
					return String();
			}
		}
		else
			return String();
	}